

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O2

void gravity_compiler_reset(gravity_compiler_t *compiler,_Bool free_core)

{
  cstring_r **ppcVar1;
  size_t sVar2;
  cstring_r *pcVar3;
  char *__ptr;
  size_t _i;
  ulong uVar4;
  
  ppcVar1 = &compiler->storage;
  if (compiler->storage != (cstring_r *)0x0) {
    sVar2 = compiler->storage->n;
    for (uVar4 = 0; pcVar3 = *ppcVar1, sVar2 != uVar4; uVar4 = uVar4 + 1) {
      if (uVar4 < pcVar3->n) {
        __ptr = pcVar3->p[uVar4];
      }
      else {
        __ptr = (char *)0x0;
      }
      free(__ptr);
    }
    free(pcVar3->p);
    free(*ppcVar1);
  }
  if (compiler->ast != (gnode_t *)0x0) {
    gnode_free(compiler->ast);
  }
  if (compiler->parser != (gravity_parser_t *)0x0) {
    gravity_parser_free(compiler->parser);
  }
  if (compiler->vm != (gravity_vm *)0x0) {
    gravity_vm_free(compiler->vm);
  }
  if (compiler->objects != (void_r *)0x0) {
    free(compiler->objects->p);
    free(compiler->objects);
  }
  if (free_core) {
    gravity_core_free();
  }
  compiler->parser = (gravity_parser_t *)0x0;
  compiler->ast = (gnode_t *)0x0;
  compiler->objects = (void_r *)0x0;
  *ppcVar1 = (cstring_r *)0x0;
  compiler->vm = (gravity_vm *)0x0;
  return;
}

Assistant:

static void gravity_compiler_reset (gravity_compiler_t *compiler, bool free_core) {
    // free memory for array of strings storage
    if (compiler->storage) {
        cstring_array_each(compiler->storage, {mem_free((void *)val);});
        gnode_array_free(compiler->storage);
    }

    // first ast then parser, don't change the release order
    if (compiler->ast) gnode_free(compiler->ast);
    if (compiler->parser) gravity_parser_free(compiler->parser);

    // at the end free mini VM and objects array
    if (compiler->vm) gravity_vm_free(compiler->vm);
    if (compiler->objects) {
        marray_destroy(*compiler->objects);
        mem_free((void*)compiler->objects);
    }

    // feel free to free core if someone requires it
    if (free_core) gravity_core_free();

    // reset internal pointers
    compiler->vm = NULL;
    compiler->ast = NULL;
    compiler->parser = NULL;
    compiler->objects = NULL;
    compiler->storage = NULL;
}